

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

void __thiscall Assimp::FIDoubleDecoder::~FIDoubleDecoder(FIDoubleDecoder *this)

{
  operator_delete(this,8);
  return;
}

Assistant:

virtual std::shared_ptr<const FIValue> decode(const uint8_t *data, size_t len) /*override*/ {
        if (len & 7) {
            throw DeadlyImportError(parseErrorMessage);
        }
        std::vector<double> value;
        size_t numDoubles = len / 8;
        value.reserve(numDoubles);
        for (size_t i = 0; i < numDoubles; ++i) {
            long long b0 = data[0], b1 = data[1], b2 = data[2], b3 = data[3], b4 = data[4], b5 = data[5], b6 = data[6], b7 = data[7];
            long long v = (b0 << 56) | (b1 << 48) | (b2 << 40) | (b3 << 32) | (b4 << 24) | (b5 << 16) | (b6 << 8) | b7;
            double f;
            memcpy(&f, &v, 8);
            value.push_back(f);
            data += 8;
        }
        return FIDoubleValue::create(std::move(value));
    }